

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harness.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  UnitTest *this;
  TestEventListeners *this_00;
  TestEventListener *pTVar3;
  quiet_event_listener *this_01;
  exception *ex;
  TestEventListener *default_printer;
  TestEventListeners *listeners;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  testing::InitGoogleMock((int *)&argv_local,argv);
  bVar1 = anon_unknown.dwarf_f99c9::loud_mode_enabled((int)argv_local,argv);
  if (!bVar1) {
    this = testing::UnitTest::GetInstance();
    this_00 = testing::UnitTest::listeners(this);
    pTVar3 = testing::TestEventListeners::default_result_printer(this_00);
    pTVar3 = testing::TestEventListeners::Release(this_00,pTVar3);
    this_01 = (quiet_event_listener *)operator_new(0x10);
    anon_unknown.dwarf_f99c9::quiet_event_listener::quiet_event_listener(this_01,pTVar3);
    testing::TestEventListeners::Append(this_00,(TestEventListener *)this_01);
  }
  iVar2 = RUN_ALL_TESTS();
  return iVar2;
}

Assistant:

int main (int argc, char ** argv) {
    PSTORE_TRY {
#if PSTORE_IS_INSIDE_LLVM
        llvm::sys::PrintStackTraceOnErrorSignal (argv[0], true /* Disable crash reporting */);
#endif

        // Since Google Mock depends on Google Test, InitGoogleMock() is
        // also responsible for initializing Google Test. Therefore there's
        // no need for calling testing::InitGoogleTest() separately.
        testing::InitGoogleMock (&argc, argv);

        // Unless the user enables "loud mode" by passing the appropriate switch, we silence much of
        // google test/mock's output so that we only see detailed information about tests that fail.
        if (!loud_mode_enabled (argc, argv)) {
            // Remove the default listener
            testing::TestEventListeners & listeners =
                testing::UnitTest::GetInstance ()->listeners ();
            testing::TestEventListener * const default_printer =
                listeners.Release (listeners.default_result_printer ());

            // Add our listener. By default everything is on (as when using the default listener)
            // but here we turn everything off so we only see the 3 lines for the result (plus any
            // failures at the end), like:
            //
            // [==========] Running 149 tests from 53 test cases.
            // [==========] 149 tests from 53 test cases ran. (1 ms total)
            // [  PASSED  ] 149 tests.

            listeners.Append (new quiet_event_listener (default_printer));
        }

#if defined(_WIN32)
        // Disable all of the possible ways Windows conspires to make automated
        // testing impossible.
        ::SetErrorMode (SEM_FAILCRITICALERRORS | SEM_NOGPFAULTERRORBOX);
#    if defined(_MSC_VER)
        ::_set_error_mode (_OUT_TO_STDERR);
        _CrtSetReportMode (_CRT_WARN, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
        _CrtSetReportFile (_CRT_WARN, _CRTDBG_FILE_STDERR);
        _CrtSetReportMode (_CRT_ERROR, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
        _CrtSetReportFile (_CRT_ERROR, _CRTDBG_FILE_STDERR);
        _CrtSetReportMode (_CRT_ASSERT, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
        _CrtSetReportFile (_CRT_ASSERT, _CRTDBG_FILE_STDERR);
#    endif
#endif
        return RUN_ALL_TESTS ();
    }